

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::PathIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,PathIntegrator *this)

{
  bool *in_R9;
  
  StringPrintf<int_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ PathIntegrator maxDepth: %d lightSampler: %s regularize: %s ]",
             (char *)&this->maxDepth,(int *)&this->lightSampler,
             (LightSamplerHandle *)&this->regularize,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string PathIntegrator::ToString() const {
    return StringPrintf("[ PathIntegrator maxDepth: %d lightSampler: %s regularize: %s ]",
                        maxDepth, lightSampler, regularize);
}